

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O1

void emit_loadn(ASMState *as,Reg r,cTValue *tv)

{
  MCode *pMVar1;
  uint uVar2;
  x86Op xo;
  
  if (tv->u64 != 0) {
    xo = XO_MOVLPD;
    if ((as->flags >> 10 & 1) == 0) {
      xo = XO_MOVSD;
    }
    emit_rma(as,xo,r,tv);
    return;
  }
  pMVar1 = as->mcp;
  pMVar1[-1] = ((byte)r & 7) + (byte)r * '\b' | 0xc0;
  pMVar1[-3] = '\x0f';
  pMVar1[-2] = 'W';
  uVar2 = r >> 3 & 1 | r >> 1 & 0x104;
  if (uVar2 == 0) {
    pMVar1 = pMVar1 + -3;
  }
  else {
    pMVar1[-4] = (byte)uVar2 | (byte)(r >> 0x10) | 0x40;
    pMVar1 = pMVar1 + -4;
  }
  as->mcp = pMVar1;
  return;
}

Assistant:

static void emit_loadn(ASMState *as, Reg r, cTValue *tv)
{
  if (tvispzero(tv))  /* Use xor only for +0. */
    emit_rr(as, XO_XORPS, r, r);
  else
    emit_rma(as, XMM_MOVRM(as), r, &tv->n);
}